

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Edge<std::pair<double,_double>_> * __thiscall
Vertex<std::pair<double,_double>_>::addEdge
          (Vertex<std::pair<double,_double>_> *this,Vertex<std::pair<double,_double>_> *dest,
          double cost)

{
  Edge<std::pair<double,_double>_> *this_00;
  Edge<std::pair<double,_double>_> *local_28;
  Edge<std::pair<double,_double>_> *edge;
  double cost_local;
  Vertex<std::pair<double,_double>_> *dest_local;
  Vertex<std::pair<double,_double>_> *this_local;
  
  edge = (Edge<std::pair<double,_double>_> *)cost;
  cost_local = (double)dest;
  dest_local = this;
  this_00 = (Edge<std::pair<double,_double>_> *)operator_new(0x18);
  Edge<std::pair<double,_double>_>::Edge
            (this_00,this,(Vertex<std::pair<double,_double>_> *)cost_local,(double)edge);
  local_28 = this_00;
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  push_back(&this->outgoing,&local_28);
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  push_back((vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
             *)((long)cost_local + 0x30),&local_28);
  return local_28;
}

Assistant:

Edge<T>* Vertex<T>::addEdge(Vertex<T> *dest, double cost) {
    Edge<T> *edge = new Edge<T>(this, dest, cost);
    this->outgoing.push_back(edge);
    dest->incoming.push_back(edge);
    return edge;
}